

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

int __thiscall RandStrParser::parseInt(RandStrParser *this)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  
  if (this->rem == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      wVar1 = utf8_ptr::s_getch((this->p).p_);
      if ((uint)(wVar1 + L'\xffffffc6') < 0xfffffff6) {
        return iVar3;
      }
      if (this->rem == 0) {
        iVar2 = -0x30;
      }
      else {
        wVar1 = utf8_ptr::s_getch((this->p).p_);
        iVar2 = wVar1 + L'\xffffffd0';
      }
      iVar3 = iVar3 * 10 + iVar2;
      skip(this);
    } while (this->rem != 0);
  }
  return iVar3;
}

Assistant:

int parseInt()
    {
        /* parse digits in the input */
        int acc;
        for (acc = 0 ; more() && is_digit(getch()) ; skip())
        {
            /* add this digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(getch());
        }

        /* return the accumulator value */
        return acc;
    }